

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::readValue(Reader *this)

{
  Location pCVar1;
  Value *pVVar2;
  Location pCVar3;
  ValueHolder VVar4;
  bool bVar5;
  ulong uVar6;
  ValueHolder *pVVar7;
  _Elt_pointer ppVVar8;
  undefined8 uVar9;
  ushort uVar10;
  ushort uVar11;
  pointer pcVar12;
  ValueHolder VVar13;
  ValueHolder *pVVar14;
  pointer unaff_R12;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Token token;
  Token local_f8;
  string local_e0;
  ValueHolder local_c0 [2];
  undefined8 local_b0;
  ValueHolder local_98 [2];
  undefined8 local_88;
  ValueHolder local_70;
  ushort local_68;
  undefined8 local_60;
  ValueHolder local_58;
  ValueHolder VStack_50;
  ValueHolder local_48 [2];
  undefined8 local_38;
  
  skipCommentTokens(this,&local_f8);
  if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
    uVar6 = std::__cxx11::string::find_last_not_of
                      ((char *)&this->commentsBefore_,0x12779d,0xffffffffffffffff);
    if (uVar6 == 0xffffffffffffffff) {
      (this->commentsBefore_)._M_string_length = 0;
      pcVar12 = (this->commentsBefore_)._M_dataplus._M_p;
    }
    else {
      if ((this->commentsBefore_)._M_string_length <= uVar6) {
        uVar9 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
        if (local_e0._M_dataplus._M_p != unaff_R12) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar9);
      }
      (this->commentsBefore_)._M_string_length = uVar6 + 1;
      pcVar12 = (this->commentsBefore_)._M_dataplus._M_p + uVar6 + 1;
    }
    *pcVar12 = '\0';
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setComment(ppVVar8[-1],(this->commentsBefore_)._M_dataplus._M_p,commentBefore);
    std::__cxx11::string::_M_replace
              ((ulong)&this->commentsBefore_,0,(char *)(this->commentsBefore_)._M_string_length,
               0x128233);
  }
  switch(local_f8.type_) {
  case tokenObjectBegin:
    bVar5 = readObject(this,&local_f8);
    break;
  default:
switchD_00108251_caseD_2:
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar8 = ppVVar8 + -1;
    }
    pVVar2 = *ppVVar8;
    pCVar1 = this->begin_;
    auVar16._8_4_ = (int)pCVar1;
    auVar16._0_8_ = pCVar1;
    auVar16._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar2->start_ = (long)local_f8.start_ - (long)pCVar1;
    pVVar2->limit_ = (long)local_f8.end_ - auVar16._8_8_;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Syntax error: value, object or array expected.","");
    addError(this,&local_e0,&local_f8,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    return false;
  case tokenArrayBegin:
    bVar5 = readArray(this,&local_f8);
    break;
  case tokenString:
    bVar5 = decodeString(this,&local_f8);
    goto LAB_0010848c;
  case tokenNumber:
    bVar5 = decodeNumber(this,&local_f8);
    goto LAB_0010848c;
  case tokenTrue:
    local_88 = 0;
    local_98[0].bool_ = true;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar7 = &ppVVar8[-1]->value_;
    uVar10 = *(ushort *)(pVVar7 + 1);
    VVar13 = *pVVar7;
    pVVar14 = local_98;
    goto LAB_00108418;
  case tokenFalse:
    local_b0 = 0;
    local_c0[0].bool_ = false;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar7 = &ppVVar8[-1]->value_;
    uVar10 = *(ushort *)(pVVar7 + 1);
    VVar13 = *pVVar7;
    pVVar14 = local_c0;
LAB_00108418:
    *pVVar7 = *pVVar14;
    *pVVar14 = VVar13;
    uVar11 = uVar10 & 0xfe00 | 5;
LAB_0010842c:
    *(ushort *)(pVVar7 + 1) = uVar11;
    *(ushort *)(pVVar14 + 1) = uVar10 & 0x1ff;
    VVar13 = pVVar7[3];
    VVar4 = pVVar7[4];
    pVVar7[3].int_ = 0;
    pVVar7[4].int_ = 0;
    pVVar14[3] = VVar13;
    pVVar14[4] = VVar4;
    Value::~Value((Value *)pVVar14);
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar8 = ppVVar8 + -1;
    }
    pVVar2 = *ppVVar8;
    pCVar1 = this->begin_;
    auVar15._8_4_ = (int)pCVar1;
    auVar15._0_8_ = pCVar1;
    auVar15._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar2->start_ = (long)local_f8.start_ - (long)pCVar1;
    pVVar2->limit_ = (long)local_f8.end_ - auVar15._8_8_;
LAB_0010848a:
    bVar5 = true;
    goto LAB_0010848c;
  case tokenNull:
    local_38 = 0;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar7 = &ppVVar8[-1]->value_;
    uVar10 = *(ushort *)(pVVar7 + 1);
    local_48[0] = *pVVar7;
    pVVar14 = local_48;
    uVar11 = uVar10 & 0xfe00;
    goto LAB_0010842c;
  case tokenArraySeparator:
    if ((this->features_).allowDroppedNullPlaceholders_ != true) goto switchD_00108251_caseD_2;
    this->current_ = this->current_ + -1;
    local_60 = 0;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar14 = &ppVVar8[-1]->value_;
    local_68 = *(ushort *)(pVVar14 + 1);
    local_70 = *pVVar14;
    *(ushort *)(pVVar14 + 1) = local_68 & 0xfe00;
    local_68 = local_68 & 0x1ff;
    local_58 = pVVar14[3];
    VStack_50 = pVVar14[4];
    *(undefined1 (*) [16])(pVVar14 + 3) = (undefined1  [16])0x0;
    Value::~Value((Value *)&local_70);
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar8 = ppVVar8 + -1;
    }
    pVVar2 = *ppVVar8;
    pCVar1 = this->begin_;
    pCVar3 = this->current_;
    pVVar2->start_ = (size_t)(pCVar3 + ~(ulong)pCVar1);
    pVVar2->limit_ = (long)pCVar3 - (long)pCVar1;
    goto LAB_0010848a;
  }
  ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar8 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar8[-1]->limit_ = (long)this->current_ - (long)this->begin_;
LAB_0010848c:
  if (this->collectComments_ == true) {
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    this->lastValueEnd_ = this->current_;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->lastValue_ = ppVVar8[-1];
  }
  return bVar5;
}

Assistant:

bool Reader::readValue() {
  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    // Remove newline characters at the end of the comments
    size_t lastNonNewline = commentsBefore_.find_last_not_of("\r\n");
    if (lastNonNewline != std::string::npos) {
      commentsBefore_.erase(lastNonNewline + 1);
    } else {
      commentsBefore_.clear();
    }

    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    currentValue() = true;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenFalse:
    currentValue() = false;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenNull:
    currentValue() = Value();
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenArraySeparator:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      currentValue() = Value();
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    }
  // Else, fall through...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  return successful;
}